

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

uint Catch::rngSeed(void)

{
  uint uVar1;
  IContext *pIVar2;
  element_type *peVar3;
  
  pIVar2 = getCurrentContext();
  (*pIVar2->_vptr_IContext[4])();
  peVar3 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x130217);
  uVar1 = (*(peVar3->super_NonCopyable)._vptr_NonCopyable[0x11])();
  return uVar1;
}

Assistant:

unsigned int rngSeed() {
        return getCurrentContext().getConfig()->rngSeed();
    }